

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O0

int_fast32_t transtime(int year,rule *rulep,int_fast32_t offset)

{
  rule_t rVar1;
  int iVar2;
  bool bVar3;
  int local_48;
  int local_40;
  int dow;
  int yy2;
  int yy1;
  int yy0;
  int m1;
  int d;
  int i;
  int_fast32_t value;
  _Bool leapyear;
  int_fast32_t offset_local;
  rule *rulep_local;
  int year_local;
  
  d = 0;
  iVar2 = _PDCLIB_is_leap(year);
  bVar3 = iVar2 != 0;
  rVar1 = rulep->type;
  if (rVar1 == JULIAN_DAY) {
    d = (rulep->day + -1) * 0x15180;
    if ((bVar3) && (0x3b < rulep->day)) {
      d = d + 0x15180;
    }
  }
  else if (rVar1 == DAY_OF_YEAR) {
    d = rulep->day * 0x15180;
  }
  else if (rVar1 == MONTH_NTH_DAY_OF_WEEK) {
    local_48 = year;
    if (rulep->mon < 3) {
      local_48 = year + -1;
    }
    local_40 = ((((rulep->mon + 9) % 0xc + 1) * 0x1a + -2) / 10 + 1 + local_48 % 100 +
                (local_48 % 100) / 4 + (local_48 / 100) / 4 + (local_48 / 100) * -2) % 7;
    if (local_40 < 0) {
      local_40 = local_40 + 7;
    }
    yy0 = rulep->day - local_40;
    if (yy0 < 0) {
      yy0 = yy0 + 7;
    }
    m1 = 1;
    for (; (m1 < rulep->week && (yy0 + 7 < mon_lengths[bVar3][rulep->mon + -1])); yy0 = yy0 + 7) {
      m1 = m1 + 1;
    }
    d = yy0 * 0x15180;
    for (m1 = 0; m1 < rulep->mon + -1; m1 = m1 + 1) {
      d = mon_lengths[bVar3][m1] * 0x15180 + d;
    }
  }
  return d + rulep->time + offset;
}

Assistant:

static int_fast32_t transtime( const int year, struct rule const * rulep, const int_fast32_t offset )
{
    bool         leapyear;
    int_fast32_t value = 0;
    int          i;
    int          d;
    int          m1;
    int          yy0;
    int          yy1;
    int          yy2;
    int          dow;

    leapyear = _PDCLIB_is_leap( year );

    switch ( rulep->type )
    {
        case JULIAN_DAY:
            /* Jn - Julian day, 1 == January 1, 60 == March 1 even in leap
               years.
               In non-leap years, or if the day number is 59 or less, just
               add SECSPERDAY times the day number-1 to the time of
               January 1, midnight, to get the day.
            */
            value = ( rulep->day - 1 ) * SECSPERDAY;

            if ( leapyear && rulep->day >= 60 )
            {
                value += SECSPERDAY;
            }

            break;

        case DAY_OF_YEAR:
            /* n - day of year.
               Just add SECSPERDAY times the day number to the time of
               January 1, midnight, to get the day.
            */
            value = rulep->day * SECSPERDAY;
            break;

        case MONTH_NTH_DAY_OF_WEEK:
            /* Mm.n.d - nth "dth day" of month m.  */

            /* Use Zeller's Congruence to get day-of-week of first day of
               month.
            */
            m1 = ( rulep->mon + 9 ) % 12 + 1;
            yy0 = ( rulep->mon <= 2 ) ? ( year - 1 ) : year;
            yy1 = yy0 / 100;
            yy2 = yy0 % 100;
            dow = ( ( 26 * m1 - 2 ) / 10 + 1 + yy2 + yy2 / 4 + yy1 / 4 - 2 * yy1 ) % 7;

            if ( dow < 0 )
            {
                dow += DAYSPERWEEK;
            }

            /* "dow" is the day-of-week of the first day of the month. Get
               the day-of-month (zero-origin) of the first "dow" day of the
               month.
            */
            d = rulep->day - dow;

            if ( d < 0 )
            {
                d += DAYSPERWEEK;
            }

            for ( i = 1; i < rulep->week; ++i )
            {
                if ( d + DAYSPERWEEK >= mon_lengths[ leapyear ][ rulep->mon - 1 ] )
                {
                    break;
                }

                d += DAYSPERWEEK;
            }

            /* "d" is the day-of-month (zero-origin) of the day we want. */
            value = d * SECSPERDAY;

            for ( i = 0; i < rulep->mon - 1; ++i )
            {
                value += mon_lengths[ leapyear ][ i ] * SECSPERDAY;
            }

            break;
    }

    /* "value" is the year-relative time of 00:00:00 UT on the day in
       question. To get the year-relative time of the specified local
       time on that day, add the transition time and the current offset
       from UT.
    */
    return value + rulep->time + offset;
}